

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O2

matrix __thiscall sptk::swipe::copym(swipe *this,matrix yr_matrix)

{
  ulong uVar1;
  ulong uVar2;
  matrix mVar3;
  
  mVar3 = makem((int)this,(int)((ulong)this >> 0x20));
  uVar1 = 0;
  uVar2 = 0;
  if (0 < (int)this) {
    uVar2 = (ulong)this & 0xffffffff;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    memcpy(mVar3.m[uVar1],*(void **)(yr_matrix._0_8_ + uVar1 * 8),
           (long)this >> 0x1d & 0xfffffffffffffff8);
  }
  return mVar3;
}

Assistant:

matrix copym(matrix yr_matrix) {
    matrix nw_matrix = makem(yr_matrix.x, yr_matrix.y);
    int i;
    for (i = 0; i < yr_matrix.x; i++) // does not assume contiguity
        memcpy(nw_matrix.m[i], yr_matrix.m[i],
               sizeof(double) * yr_matrix.y);
    return(nw_matrix);
}